

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * xname2(obj *obj,boolean ignore_oquan)

{
  long lVar1;
  long lVar2;
  char cVar3;
  boolean bVar4;
  uint i;
  int iVar5;
  objclass *poVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  char *local_180;
  char *local_178;
  char *local_140;
  char *local_138;
  char *local_f0;
  char *local_d0;
  char *local_c0;
  char *local_b0;
  char *local_88;
  bool local_6c;
  bool local_6b;
  bool local_6a;
  bool local_69;
  char *rock;
  fruit *f;
  boolean dump_ID_flag;
  boolean bknown;
  boolean dknown;
  boolean known;
  char *un;
  char *dn;
  char *actualn;
  int nn;
  objclass *ocl;
  char *pcStack_20;
  int typ;
  char *buf;
  boolean ignore_oquan_local;
  obj *obj_local;
  
  i = (uint)obj->otyp;
  poVar6 = objects + (int)i;
  local_69 = true;
  if ((poVar6->field_0x10 & 1) == 0) {
    local_6a = false;
    if (((((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) && (local_6a = false, obj->otyp != 0xda)) &&
        (local_6a = false, obj->otyp != 0xdb)) && (local_6a = false, obj->otyp != 0xdc)) {
      local_6b = true;
      if ((viz_array[obj->oy][obj->ox] & 2U) == 0) {
        local_6c = false;
        if (u.ux == obj->ox) {
          local_6c = u.uy == obj->oy;
        }
        local_6b = local_6c;
      }
      local_6a = local_6b;
    }
    local_69 = local_6a;
  }
  dn = obj_descr[poVar6->oc_name_idx].oc_name;
  local_d0 = obj_descr[poVar6->oc_descr_idx].oc_descr;
  pcVar10 = poVar6->oc_uname;
  f._7_1_ = (byte)(*(uint *)&obj->field_0x4a >> 4) & 1;
  f._6_1_ = (byte)(*(uint *)&obj->field_0x4a >> 5) & 1;
  f._5_1_ = (byte)(*(uint *)&obj->field_0x4a >> 6) & 1;
  cVar3 = (char)program_state.gameover;
  pcVar7 = nextobuf();
  pcStack_20 = pcVar7 + 0x50;
  if ((urole.malenum == 0x165) && (pcVar8 = Japanese_item_name(i), pcVar8 != (char *)0x0)) {
    dn = Japanese_item_name(i);
  }
  *pcStack_20 = '\0';
  if (((local_69 == false) && (((byte)poVar6->field_0x10 >> 2 & 1) != 0)) &&
     (((byte)poVar6->field_0x10 >> 6 & 1) != 0)) {
    f._7_1_ = 0;
  }
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    f._6_1_ = 1;
  }
  if ((((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) && (obj->otyp != 0xda)) &&
     ((obj->otyp != 0xdb && (obj->otyp != 0xdc)))) {
    f._6_1_ = 1;
  }
  if (urole.malenum == 0x161) {
    f._5_1_ = 1;
  }
  bVar4 = obj_is_pname(obj);
  if (bVar4 == '\0') {
    if ((((obj->oprops_known & 0x80000000U) != 0) && (cVar3 == '\0')) &&
       ((obj->oprops & (obj->oprops_known ^ 0xffffffffffffffffU)) != 0)) {
      strcat(pcStack_20,"magical ");
    }
    if ((((*(uint *)&obj->field_0x4a >> 0xd & 1) != 0) && (obj->otyp != 0xda)) &&
       ((obj->otyp != 0xdb && ((obj->otyp != 0xdc && (pcVar10 == (char *)0x0)))))) {
      strcat(pcStack_20,"prize ");
    }
    switch(obj->oclass) {
    case '\x02':
      if ((((obj->oclass == '\x02') && (-0x1b < objects[obj->otyp].oc_subtyp)) &&
          (objects[obj->otyp].oc_subtyp < -0x15)) && ((*(uint *)&obj->field_0x4a >> 0xf & 1) != 0))
      {
        strcat(pcStack_20,"poisoned ");
      }
    case '\x06':
    case '\x11':
      if (i == 0xed) {
        strcat(pcStack_20,"pair of ");
      }
      if (f._6_1_ == 0) {
        local_b0 = local_d0;
        if (local_d0 == (char *)0x0) {
          local_b0 = dn;
        }
        strcat(pcStack_20,local_b0);
      }
      else {
        if (((obj->oprops & 4U) != 0) && (((obj->oprops_known & 4U) != 0 || (cVar3 != '\0')))) {
          if ((obj->oprops_known & 4U) == 0) {
            strcat(pcStack_20,"[thirsty] ");
          }
          else {
            strcat(pcStack_20,"thirsty ");
          }
        }
        if (((obj->oprops & 8U) != 0) && (((obj->oprops_known & 8U) != 0 || (cVar3 != '\0')))) {
          if ((obj->oprops_known & 8U) == 0) {
            strcat(pcStack_20,"[vorpal] ");
          }
          else {
            strcat(pcStack_20,"vorpal ");
          }
        }
        if (local_69 == false) {
          if (pcVar10 == (char *)0x0) {
            if (((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
                (obj->otyp == 0xdb)) || ((obj->otyp == 0xdc || (obj->oclass == '\x02')))) {
              if (local_d0 == (char *)0x0) {
                local_d0 = dn;
              }
              strcat(pcStack_20,local_d0);
            }
            else {
              strcat(pcStack_20,"tool");
            }
          }
          else {
            local_c0 = local_d0;
            if (local_d0 == (char *)0x0) {
              local_c0 = dn;
            }
            strcat(pcStack_20,local_c0);
          }
        }
        else {
          strcat(pcStack_20,dn);
        }
        lVar1 = obj->oprops;
        lVar2 = obj->oprops_known;
        local_f0 = pcStack_20;
        if (i == 0xed) {
          pcVar8 = strstr(pcStack_20,"pair of ");
          local_f0 = pcVar8 + 8;
        }
        pcVar8 = strstr(local_f0," of ");
        propnames(pcStack_20,lVar1,lVar2,'\x01',pcVar8 != (char *)0x0);
        if ((local_69 == false) && (pcVar10 != (char *)0x0)) {
          pcVar8 = eos(pcStack_20);
          sprintf(pcVar8," called %s",pcVar10);
        }
      }
      if (i == 0xf6) {
        pcVar10 = eos(pcStack_20);
        pcVar8 = mons_mname(mons + obj->corpsenm);
        pcVar8 = strchr("aeiouAEIOU",(int)*pcVar8);
        pcVar9 = "";
        if (pcVar8 != (char *)0x0) {
          pcVar9 = "n";
        }
        pcVar8 = mons_mname(mons + obj->corpsenm);
        sprintf(pcVar10," of a%s %s",pcVar9,pcVar8);
      }
      break;
    case '\x03':
      if ((0x5e < (int)i) && ((int)i < 0x6a)) {
        strcat(pcStack_20,"set of ");
      }
      if (((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x04')) ||
         ((obj->oclass == '\x03' && (objects[obj->otyp].oc_subtyp == '\x03')))) {
        strcat(pcStack_20,"pair of ");
      }
      if (((f._6_1_ != 0) && ((obj->oprops & 0x40U) != 0)) &&
         (((obj->oprops_known & 0x40U) != 0 || (cVar3 != '\0')))) {
        if ((obj->oprops_known & 0x40U) == 0) {
          strcat(pcStack_20,"[oilskin] ");
        }
        else {
          strcat(pcStack_20,"oilskin ");
        }
      }
      if (((obj->otyp < 0x89) || (0x8b < obj->otyp)) || (f._6_1_ != 0)) {
        if ((obj->otyp == 0x8e) && (f._6_1_ == 0)) {
          strcpy(pcStack_20,"smooth shield");
          propnames(pcStack_20,obj->oprops,obj->oprops_known,'\0','\0');
        }
        else if (local_69 == false) {
          if ((pcVar10 == (char *)0x0) &&
             ((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0 || (obj->otyp == 0xda)) ||
              ((obj->otyp == 0xdb || (obj->otyp == 0xdc)))))) {
            strcat(pcStack_20,local_d0);
            lVar1 = obj->oprops;
            lVar2 = obj->oprops_known;
            if (((int)i < 0x5f) || (0x69 < (int)i)) {
              if (((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x04')) ||
                 ((local_140 = pcStack_20, obj->oclass == '\x03' &&
                  (objects[obj->otyp].oc_subtyp == '\x03')))) {
                pcVar10 = strstr(pcStack_20,"pair of ");
                local_140 = pcVar10 + 8;
              }
              local_138 = local_140;
            }
            else {
              local_138 = strstr(pcStack_20,"set of ");
              local_138 = local_138 + 7;
            }
            pcVar10 = strstr(local_138," of ");
            propnames(pcStack_20,lVar1,lVar2,'\0',pcVar10 != (char *)0x0);
          }
          else {
            if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x04')) {
              strcat(pcStack_20,"boots");
            }
            else if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x03')) {
              strcat(pcStack_20,"gloves");
            }
            else if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x05')) {
              strcat(pcStack_20,"cloak");
            }
            else if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x02')) {
              strcat(pcStack_20,"helmet");
            }
            else if ((obj->oclass == '\x03') && (objects[obj->otyp].oc_subtyp == '\x01')) {
              strcat(pcStack_20,"shield");
            }
            else {
              strcat(pcStack_20,"armor");
            }
            if (pcVar10 != (char *)0x0) {
              propnames(pcStack_20,obj->oprops,obj->oprops_known,'\0','\0');
              strcat(pcStack_20," called ");
              strcat(pcStack_20,pcVar10);
            }
          }
        }
        else {
          strcat(pcStack_20,dn);
          lVar1 = obj->oprops;
          lVar2 = obj->oprops_known;
          pcVar10 = strstr(dn," of ");
          propnames(pcStack_20,lVar1,lVar2,'\0',pcVar10 != (char *)0x0);
        }
      }
      else {
        strcpy(pcStack_20,"shield");
        propnames(pcStack_20,obj->oprops,obj->oprops_known,'\0','\0');
      }
      break;
    case '\x04':
      if (f._6_1_ == 0) {
        strcat(pcStack_20,"ring");
      }
      else {
        if (local_69 == false) {
          if (pcVar10 == (char *)0x0) {
            if ((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
               ((obj->otyp == 0xdb || (obj->otyp == 0xdc)))) {
              pcVar8 = eos(pcStack_20);
              sprintf(pcVar8,"%s ring",local_d0);
            }
            else {
              strcat(pcStack_20,"ring");
            }
          }
          else {
            strcat(pcStack_20,"ring");
          }
        }
        else {
          pcVar8 = eos(pcStack_20);
          sprintf(pcVar8,"ring of %s",dn);
        }
        propnames(pcStack_20,obj->oprops,obj->oprops_known,'\0',local_69);
        if ((local_69 == false) && (pcVar10 != (char *)0x0)) {
          pcVar8 = eos(pcStack_20);
          sprintf(pcVar8," called %s",pcVar10);
        }
      }
      break;
    case '\x05':
      if (f._6_1_ == 0) {
        strcat(pcStack_20,"amulet");
      }
      else {
        if ((i == 0xd9) || (i == 0xd8)) {
          local_88 = local_d0;
          if (f._7_1_ != 0) {
            local_88 = dn;
          }
          strcat(pcStack_20,local_88);
        }
        else if (local_69 == false) {
          if ((pcVar10 == (char *)0x0) &&
             (((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0 || (obj->otyp == 0xda)) ||
               (obj->otyp == 0xdb)) || (obj->otyp == 0xdc)))) {
            pcVar8 = eos(pcStack_20);
            sprintf(pcVar8,"%s amulet",local_d0);
          }
          else {
            strcat(pcStack_20,"amulet");
          }
        }
        else {
          strcat(pcStack_20,dn);
        }
        lVar1 = obj->oprops;
        lVar2 = obj->oprops_known;
        pcVar8 = strstr(pcStack_20," of ");
        propnames(pcStack_20,lVar1,lVar2,'\0',pcVar8 != (char *)0x0);
        if ((local_69 == false) && (pcVar10 != (char *)0x0)) {
          pcVar8 = eos(pcStack_20);
          sprintf(pcVar8," called %s",pcVar10);
        }
      }
      break;
    case '\a':
      if (i == 0x11e) {
        for (rock = ffruit->fname; rock != (char *)0x0; rock = *(char **)(rock + 0x28)) {
          iVar5 = *(int *)(rock + 0x20);
          if (iVar5 < 1) {
            iVar5 = -iVar5;
          }
          if (iVar5 == obj->spe) {
            strcat(pcStack_20,rock);
            break;
          }
        }
        if (rock == (char *)0x0) {
          warning("Bad fruit #%d?",(ulong)(uint)(int)obj->spe);
        }
      }
      else if ((i == 0x120) && (bVar4 = piday(), bVar4 != '\0')) {
        strcat(pcStack_20,"irrational pie");
      }
      else {
        strcat(pcStack_20,dn);
        if ((i == 0x129) && (f._7_1_ != 0)) {
          if (obj->spe < '\x01') {
            if (obj->corpsenm == -1) {
              strcat(pcStack_20,"empty tin");
            }
            else if ((((mons[obj->corpsenm].mlet == '\x02') || (mons[obj->corpsenm].mlet == '\n'))
                     || (mons[obj->corpsenm].mlet == ' ')) ||
                    (((((mons[obj->corpsenm].mlet == '\x16' || (mons[obj->corpsenm].mlet == '\x19'))
                       || ((mons[obj->corpsenm].mlet == '\x1f' &&
                           (((long)obj->corpsenm & 0x3ffffffffffffffU) != 0x9e)))) ||
                      (((mons[obj->corpsenm].mlet == '7' &&
                        (((long)obj->corpsenm & 0x3ffffffffffffffU) != 0x106)) &&
                       (((long)obj->corpsenm & 0x3ffffffffffffffU) != 0x104)))) ||
                     ((mons[obj->corpsenm].mlet == '6' ||
                      ((mons[obj->corpsenm].mlet == '*' &&
                       (((long)obj->corpsenm & 0x3ffffffffffffffU) != 0xd6)))))))) {
              pcVar10 = eos(pcStack_20);
              pcVar8 = mons_mname(mons + obj->corpsenm);
              sprintf(pcVar10," of %s",pcVar8);
            }
            else {
              pcVar10 = eos(pcStack_20);
              pcVar8 = mons_mname(mons + obj->corpsenm);
              sprintf(pcVar10," of %s meat",pcVar8);
            }
          }
          else {
            strcat(pcStack_20," of spinach");
          }
        }
      }
      break;
    case '\b':
      if ((f._6_1_ != 0) && ((*(uint *)&obj->field_0x4a >> 8 & 3) != 0)) {
        strcat(pcStack_20,"diluted ");
      }
      if (((local_69 == false) && (pcVar10 == (char *)0x0)) && (f._6_1_ != 0)) {
        if (((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
            (obj->otyp == 0xdb)) || (obj->otyp == 0xdc)) {
          strcat(pcStack_20,local_d0);
          strcat(pcStack_20," ");
        }
        strcat(pcStack_20,"potion");
      }
      else {
        strcat(pcStack_20,"potion");
        if (f._6_1_ != 0) {
          if (local_69 == false) {
            strcat(pcStack_20," called ");
            strcat(pcStack_20,pcVar10);
          }
          else {
            strcat(pcStack_20," of ");
            if (((i == 0x14f) && (f._5_1_ != 0)) &&
               (((*(uint *)&obj->field_0x4a >> 1 & 1) != 0 || ((*(uint *)&obj->field_0x4a & 1) != 0)
                ))) {
              pcVar10 = "unholy ";
              if ((*(uint *)&obj->field_0x4a >> 1 & 1) != 0) {
                pcVar10 = "holy ";
              }
              strcat(pcStack_20,pcVar10);
            }
            strcat(pcStack_20,dn);
          }
        }
      }
      break;
    case '\t':
      if (f._6_1_ == 0) {
        strcat(pcStack_20,"scroll");
      }
      else if (local_69 == false) {
        if (pcVar10 == (char *)0x0) {
          if (((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
              (obj->otyp == 0xdb)) || (obj->otyp == 0xdc)) {
            if (((byte)poVar6->field_0x10 >> 4 & 1) == 0) {
              strcat(pcStack_20,local_d0);
              strcat(pcStack_20," scroll");
            }
            else {
              strcat(pcStack_20,"scroll labeled ");
              strcat(pcStack_20,local_d0);
            }
          }
          else {
            strcat(pcStack_20,"scroll");
          }
        }
        else {
          strcat(pcStack_20,"scroll called ");
          strcat(pcStack_20,pcVar10);
        }
      }
      else {
        strcat(pcStack_20,"scroll of ");
        strcat(pcStack_20,dn);
      }
      break;
    case '\n':
      if (f._6_1_ == 0) {
        strcat(pcStack_20,"spellbook");
      }
      else if (local_69 == false) {
        if (pcVar10 == (char *)0x0) {
          if ((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
             ((obj->otyp == 0xdb || (obj->otyp == 0xdc)))) {
            pcVar10 = eos(pcStack_20);
            sprintf(pcVar10,"%s spellbook",local_d0);
          }
          else {
            strcat(pcStack_20,"spellbook");
          }
        }
        else {
          pcVar8 = eos(pcStack_20);
          sprintf(pcVar8,"spellbook called %s",pcVar10);
        }
      }
      else {
        if (i != 0x1bd) {
          strcat(pcStack_20,"spellbook of ");
        }
        strcat(pcStack_20,dn);
      }
      break;
    case '\v':
      if (f._6_1_ == 0) {
        strcat(pcStack_20,"wand");
      }
      else if (local_69 == false) {
        if (pcVar10 == (char *)0x0) {
          if ((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
             ((obj->otyp == 0xdb || (obj->otyp == 0xdc)))) {
            pcVar10 = eos(pcStack_20);
            sprintf(pcVar10,"%s wand",local_d0);
          }
          else {
            strcat(pcStack_20,"wand");
          }
        }
        else {
          pcVar8 = eos(pcStack_20);
          sprintf(pcVar8,"wand called %s",pcVar10);
        }
      }
      else {
        pcVar10 = eos(pcStack_20);
        sprintf(pcVar10,"wand of %s",dn);
      }
      break;
    case '\f':
    case '\x10':
      strcat(pcStack_20,dn);
      break;
    case '\r':
      pcVar8 = "gem";
      if ((*(ushort *)&poVar6->field_0x11 >> 4 & 0x1f) == 0x15) {
        pcVar8 = "stone";
      }
      if (f._6_1_ == 0) {
        strcat(pcStack_20,pcVar8);
      }
      else if (local_69 == false) {
        if (pcVar10 == (char *)0x0) {
          if (((((*(uint *)&obj->field_0x4a >> 0xd & 1) == 0) || (obj->otyp == 0xda)) ||
              (obj->otyp == 0xdb)) || (obj->otyp == 0xdc)) {
            pcVar10 = eos(pcStack_20);
            sprintf(pcVar10,"%s %s",local_d0,pcVar8);
          }
          else {
            strcat(pcStack_20,pcVar8);
          }
        }
        else {
          pcVar9 = eos(pcStack_20);
          sprintf(pcVar9,"%s called %s",pcVar8,pcVar10);
        }
      }
      else {
        strcat(pcStack_20,dn);
        if ((i == 0x212) ||
           (((((((*(ushort *)&objects[(int)i].field_0x11 >> 4 & 0x1f) == 0x14 && (i != 0x1f0)) &&
               (i != 0x1f2)) && ((i != 0x1f1 && (i != 500)))) && (i != 0x1f5)) &&
            ((i != 0x1f6 && (i != 0x1fd)))))) {
          strcat(pcStack_20," stone");
        }
      }
      break;
    case '\x0e':
      if (i == 0x215) {
        pcVar10 = eos(pcStack_20);
        bVar11 = false;
        if (urole.malenum == 0x159) {
          bVar11 = (obj->spe & 1U) != 0;
        }
        pcVar8 = "";
        if (bVar11) {
          pcVar8 = "historic ";
        }
        if ((mons[obj->corpsenm].mflags2 & 0x80000) == 0) {
          if ((mons[obj->corpsenm].geno & 0x1000) == 0) {
            pcVar9 = mons_mname(mons + obj->corpsenm);
            pcVar9 = strchr("aeiouAEIOU",(int)*pcVar9);
            local_180 = "a ";
            if (pcVar9 != (char *)0x0) {
              local_180 = "an ";
            }
          }
          else {
            local_180 = "the ";
          }
          local_178 = local_180;
        }
        else {
          local_178 = "";
        }
        pcVar9 = mons_mname(mons + obj->corpsenm);
        sprintf(pcVar10,"%s%s of %s%s",pcVar8,dn,local_178,pcVar9);
      }
      else {
        strcat(pcStack_20,dn);
      }
      break;
    case '\x0f':
      pcVar10 = eos(pcStack_20);
      pcVar8 = "";
      if ((uint)poVar6->oc_weight < obj->owt) {
        pcVar8 = "very ";
      }
      sprintf(pcVar10,"%sheavy iron ball",pcVar8);
      break;
    default:
      sprintf(pcStack_20,"glorkum %d %d %d",(ulong)(uint)(int)obj->oclass,(ulong)i,
              (ulong)(uint)(int)obj->spe);
    }
    if ((ignore_oquan == '\0') && (obj->quan != 1)) {
      pcVar10 = makeplural(pcStack_20);
      strcpy(pcStack_20,pcVar10);
    }
    if ((obj->onamelth == '\0') || (f._6_1_ == 0)) goto LAB_0026fde8;
    strcat(pcStack_20," named ");
  }
  strcat(pcStack_20,(char *)((long)obj->oextra + (long)(int)obj->oxlth));
LAB_0026fde8:
  iVar5 = strncasecmp(pcStack_20,"the ",4);
  if (iVar5 == 0) {
    pcStack_20 = pcVar7 + 0x54;
  }
  return pcStack_20;
}

Assistant:

static char *xname2(const struct obj *obj, boolean ignore_oquan)
{
	char *buf;
	int typ = obj->otyp;
	struct objclass *ocl = &objects[typ];
	int nn = ocl->oc_name_known ||
		 /* only reveal level prizes when in sight */
		 (Is_prize(obj) &&
		  (cansee(obj->ox, obj->oy) ||
		   /* even reveal when Sokoban prize only felt */
		   (u.ux == obj->ox && u.uy == obj->oy)));
	const char *actualn = OBJ_NAME(*ocl);
	const char *dn = OBJ_DESCR(*ocl);
	const char *un = ocl->oc_uname;
	boolean known = obj->known;
	boolean dknown = obj->dknown;
	boolean bknown = obj->bknown;
	boolean dump_ID_flag = program_state.gameover;

	buf = nextobuf() + PREFIX;	/* leave room for "17 -3 " */
	if (Role_if (PM_SAMURAI) && Japanese_item_name(typ))
		actualn = Japanese_item_name(typ);

	buf[0] = '\0';
	
	/*
	 * clean up known when it's tied to oc_name_known, eg after AD_DRIN
	 * This is only required for unique objects since the article
	 * printed for the object is tied to the combination of the two
	 * and printing the wrong article gives away information.
	 */
	if (!nn && ocl->oc_uses_known && ocl->oc_unique) known = 0;
	if (!Blind) dknown = TRUE;
	/* needed, otherwise BoH only shows up as "bag" when blind */
	if (Is_prize(obj)) dknown = TRUE;
	if (Role_if (PM_PRIEST)) bknown = TRUE;
	if (obj_is_pname(obj))
	    goto nameit;

	/*
	 * Give "magical" prefix to objects with properties as long as not all of
	 * them are known.
	 */
	if ((obj->oprops_known & ITEM_MAGICAL) && !dump_ID_flag &&
	    (obj->oprops & ~obj->oprops_known))
	    strcat(buf, "magical ");

	/* prizes suppress description of objects detected/remembered from afar */
	if (Is_prize(obj) && !un)
	    strcat(buf, "prize ");

	switch (obj->oclass) {
	    case AMULET_CLASS:
		if (!dknown) {
		    strcat(buf, "amulet");
		} else {
		    if (typ == AMULET_OF_YENDOR ||
			typ == FAKE_AMULET_OF_YENDOR)
			/* each must be identified individually */
			strcat(buf, known ? actualn : dn);
		    else if (nn)
			strcat(buf, actualn);
		    else if (un || Is_prize(obj))
			strcat(buf, "amulet"); /* u-named after props */
		    else
			sprintf(eos(buf), "%s amulet", dn);

		    propnames(buf, obj->oprops, obj->oprops_known, FALSE,
			      !!strstr(buf, " of "));

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		break;
	    case WEAPON_CLASS:
		if (is_poisonable(obj) && obj->opoisoned)
		    strcat(buf, "poisoned ");
		/* fall through */
	    case VENOM_CLASS:
	    case TOOL_CLASS:
		if (typ == LENSES)
		    strcat(buf, "pair of ");

		if (!dknown) {
		    strcat(buf, dn ? dn : actualn);
		} else {
		    if ((obj->oprops & ITEM_DRLI) &&
			((obj->oprops_known & ITEM_DRLI) || dump_ID_flag)) {
			if (obj->oprops_known & ITEM_DRLI)
			    strcat(buf, "thirsty ");
			else
			    strcat(buf, "[thirsty] ");
		    }
		    if ((obj->oprops & ITEM_VORPAL) &&
			((obj->oprops_known & ITEM_VORPAL) || dump_ID_flag)) {
			if (obj->oprops_known & ITEM_VORPAL)
			    strcat(buf, "vorpal ");
			else
			    strcat(buf, "[vorpal] ");
		    }

		    if (nn)
			strcat(buf, actualn);
		    else if (un)
			strcat(buf, dn ? dn : actualn); /* u-named after props */
		    else if (Is_prize(obj) && obj->oclass != WEAPON_CLASS)
			strcat(buf, "tool");
		    else
			strcat(buf, dn ? dn : actualn);

		    /* avoid "pair of lenses and fire" */
		    propnames(buf, obj->oprops, obj->oprops_known, TRUE,
			      !!strstr((typ == LENSES ?
					    strstr(buf, "pair of ") + 8 :
					    buf), " of "));

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		/* If we use an() here we'd have to remember never to use */
		/* it whenever calling doname() or xname(). */
		if (typ == FIGURINE)
		    sprintf(eos(buf), " of a%s %s",
			strchr(vowels,*(mons_mname(&mons[obj->corpsenm]))) ? "n" : "",
			mons_mname(&mons[obj->corpsenm]));
		break;
	    case ARMOR_CLASS:
		if (Is_dragon_scales(typ)) strcat(buf, "set of ");
		if (is_boots(obj) || is_gloves(obj)) strcat(buf, "pair of ");

		if (dknown && (obj->oprops & ITEM_OILSKIN) &&
		    ((obj->oprops_known & ITEM_OILSKIN) || dump_ID_flag)) {
		    if (obj->oprops_known & ITEM_OILSKIN)
			strcat(buf, "oilskin ");
		    else
			strcat(buf, "[oilskin] ");
		}

		if (obj->otyp >= ELVEN_SHIELD && obj->otyp <= ORCISH_SHIELD
				&& !dknown) {
			strcpy(buf, "shield");
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  FALSE);
			break;
		}
		if (obj->otyp == SHIELD_OF_REFLECTION && !dknown) {
			strcpy(buf, "smooth shield");
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  FALSE);
			break;
		}

		if (nn) {
			strcat(buf, actualn);
			/* allow "pair of boots of fire resistance" */
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  !!strstr(actualn, " of "));
		} else if (un || Is_prize(obj)) {
			if (is_boots(obj))
				strcat(buf,"boots");
			else if (is_gloves(obj))
				strcat(buf,"gloves");
			else if (is_cloak(obj))
				strcat(buf,"cloak");
			else if (is_helmet(obj))
				strcat(buf,"helmet");
			else if (is_shield(obj))
				strcat(buf,"shield");
			else
				strcat(buf,"armor");
			if (un) {
				propnames(buf, obj->oprops, obj->oprops_known, FALSE,
					  FALSE);
				strcat(buf, " called ");
				strcat(buf, un);
			}
		} else {
			strcat(buf, dn);
			/* skip "set of"/"pair of" for proper wording of
			 * "set of draken scales of fire resistance" */
			propnames(buf, obj->oprops, obj->oprops_known, FALSE,
				  !!strstr((Is_dragon_scales(typ) ?
						strstr(buf, "set of ") + 7:
					    (is_boots(obj) || is_gloves(obj)) ?
						strstr(buf, "pair of ") + 8:
						buf), " of "));
		}
		break;
	    case FOOD_CLASS:
		if (typ == SLIME_MOLD) {
			struct fruit *f;

			for (f=ffruit; f; f = f->nextf) {
				/* Object naming may occur due to bones trimming,
				 * where fids may be negative. */
				if (abs(f->fid) == obj->spe) {
					strcat(buf, f->fname);
					break;
				}
			}
			if (!f) warning("Bad fruit #%d?", obj->spe);
			break;
		} else if (typ == CREAM_PIE && piday()) {
			strcat(buf, "irrational pie");
			break;
		}

		strcat(buf, actualn);
		if (typ == TIN && known) {
		    if (obj->spe > 0)
			strcat(buf, " of spinach");
		    else if (obj->corpsenm == NON_PM)
		        strcat(buf, "empty tin");
		    else if (vegetarian(&mons[obj->corpsenm]))
			sprintf(eos(buf), " of %s", mons_mname(&mons[obj->corpsenm]));
		    else
			sprintf(eos(buf), " of %s meat", mons_mname(&mons[obj->corpsenm]));
		}
		break;
	    case COIN_CLASS:
	    case CHAIN_CLASS:
		strcat(buf, actualn);
		break;
	    case ROCK_CLASS:
		if (typ == STATUE)
		    sprintf(eos(buf), "%s%s of %s%s",
			(Role_if (PM_ARCHEOLOGIST) && (obj->spe & STATUE_HISTORIC)) ? "historic " : "" ,
			actualn,
			type_is_pname(&mons[obj->corpsenm]) ? "" :
			  (mons[obj->corpsenm].geno & G_UNIQ) ? "the " :
			    (strchr(vowels,*(mons_mname(&mons[obj->corpsenm]))) ?
								"an " : "a "),
			mons_mname(&mons[obj->corpsenm]));
		else strcat(buf, actualn);
		break;
	    case BALL_CLASS:
		sprintf(eos(buf), "%sheavy iron ball",
			(obj->owt > ocl->oc_weight) ? "very " : "");
		break;
	    case POTION_CLASS:
		if (dknown && obj->odiluted)
			strcat(buf, "diluted ");
		if (nn || un || !dknown) {
			strcat(buf, "potion");
			if (!dknown) break;
			if (nn) {
			    strcat(buf, " of ");
			    if (typ == POT_WATER &&
				bknown && (obj->blessed || obj->cursed)) {
				strcat(buf, obj->blessed ? "holy " : "unholy ");
			    }
			    strcat(buf, actualn);
			} else {
				strcat(buf, " called ");
				strcat(buf, un);
			}
		} else {
			if (!Is_prize(obj)) {
			    strcat(buf, dn);
			    strcat(buf, " ");
			}
			strcat(buf, "potion");
		}
		break;
	case SCROLL_CLASS:
		if (!dknown) {
		    strcat(buf, "scroll");
		    break;
		}
		if (nn) {
			strcat(buf, "scroll of ");
			strcat(buf, actualn);
		} else if (un) {
			strcat(buf, "scroll called ");
			strcat(buf, un);
		} else if (Is_prize(obj)) {
			strcat(buf, "scroll");
		} else if (ocl->oc_magic) {
			strcat(buf, "scroll labeled ");
			strcat(buf, dn);
		} else {
			strcat(buf, dn);
			strcat(buf, " scroll");
		}
		break;
	case WAND_CLASS:
		if (!dknown)
			strcat(buf, "wand");
		else if (nn)
			sprintf(eos(buf), "wand of %s", actualn);
		else if (un)
			sprintf(eos(buf), "wand called %s", un);
		else if (Is_prize(obj))
			strcat(buf, "wand");
		else
			sprintf(eos(buf), "%s wand", dn);
		break;
	case SPBOOK_CLASS:
		if (!dknown) {
			strcat(buf, "spellbook");
		} else if (nn) {
			if (typ != SPE_BOOK_OF_THE_DEAD)
			    strcat(buf, "spellbook of ");
			strcat(buf, actualn);
		} else if (un) {
			sprintf(eos(buf), "spellbook called %s", un);
		} else if (Is_prize(obj)) {
			strcat(buf, "spellbook");
		} else {
			sprintf(eos(buf), "%s spellbook", dn);
		}
		break;
	case RING_CLASS:
		if (!dknown) {
		    strcat(buf, "ring");
		} else {
		    if (nn)
			sprintf(eos(buf), "ring of %s", actualn);
		    else if (un)
			strcat(buf, "ring"); /* u-named after props */
		    else if (Is_prize(obj))
			strcat(buf, "ring");
		    else
			sprintf(eos(buf), "%s ring", dn);

		    propnames(buf, obj->oprops, obj->oprops_known, FALSE, nn);

		    if (!nn && un)
			sprintf(eos(buf), " called %s", un);
		}
		break;
	case GEM_CLASS:
	    {
		const char *rock =
			    (ocl->oc_material == MINERAL) ? "stone" : "gem";
		if (!dknown) {
		    strcat(buf, rock);
		} else if (!nn) {
		    if (un) sprintf(eos(buf), "%s called %s", rock, un);
		    else if (Is_prize(obj)) strcat(buf, rock);
		    else sprintf(eos(buf), "%s %s", dn, rock);
		} else {
		    strcat(buf, actualn);
		    if (GemStone(typ)) strcat(buf, " stone");
		}
		break;
	    }
	default:
		sprintf(buf,"glorkum %d %d %d", obj->oclass, typ, obj->spe);
	}
	if (!ignore_oquan && obj->quan != 1L) strcpy(buf, makeplural(buf));

	if (obj->onamelth && dknown) {
		strcat(buf, " named ");
nameit:
		strcat(buf, ONAME(obj));
	}

	if (!strncmpi(buf, "the ", 4)) buf += 4;
	return buf;
}